

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factorgraph.cpp
# Opt level: O0

void __thiscall libDAI::FactorGraph::ReadFromFile(FactorGraph *this,char *filename)

{
  byte bVar1;
  undefined8 uVar2;
  _Ios_Openmode in_ESI;
  ifstream infile;
  FactorGraph *in_stack_00000478;
  istream *in_stack_00000480;
  allocator<char> *in_stack_fffffffffffffdc0;
  char *in_stack_fffffffffffffdc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd0;
  char local_218 [24];
  string *in_stack_fffffffffffffe00;
  size_t in_stack_fffffffffffffe08;
  Exception *in_stack_fffffffffffffe10;
  
  std::ifstream::ifstream(local_218);
  std::ifstream::open(local_218,in_ESI);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    uVar2 = __cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
    Exception::Exception
              (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    __cxa_throw(uVar2,&Exception::typeinfo,Exception::~Exception);
  }
  libDAI::operator>>(in_stack_00000480,in_stack_00000478);
  std::ifstream::close();
  std::ifstream::~ifstream(local_218);
  return;
}

Assistant:

void FactorGraph::ReadFromFile( const char *filename ) {
        ifstream infile;
        infile.open( filename );
        if( infile.is_open() ) {
            try { // FIXME: no exceptions are generated by iostreams by default
                infile >> *this;
                infile.close();
            } catch (...) {
                infile.close();
                throw;
            }
        } else
            DAI_THROW(CANNOT_READ_FILE);
    }